

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O0

void __thiscall slang::ast::ClassType::computeSize(ClassType *this)

{
  LookupLocation lookupLocation;
  bool bVar1;
  uint64_t uVar2;
  Scope *in_RDI;
  uint64_t width;
  ClassPropertySymbol *prop;
  specific_symbol_iterator<slang::ast::ClassPropertySymbol> __end2;
  specific_symbol_iterator<slang::ast::ClassPropertySymbol> __begin2;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_(std::ranges::subrange_kind)0>
  *__range2;
  bool hasDynamic;
  uint64_t totalWidth;
  ASTContext context;
  SymbolMap **rhs;
  Compilation *in_stack_ffffffffffffff38;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_(std::ranges::subrange_kind)0>
  local_88;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_(std::ranges::subrange_kind)0>
  *local_78;
  byte local_69;
  ulong local_68;
  bitmask<slang::ast::ASTFlags> local_60;
  LookupLocation local_58 [4];
  undefined4 local_c;
  
  Scope::ensureElaborated(in_RDI);
  local_c = 0;
  std::optional<unsigned_long>::operator=
            ((optional<unsigned_long> *)in_stack_ffffffffffffff40.m_bits,
             (int *)in_stack_ffffffffffffff38);
  if (((ulong)in_RDI[2].lastMember & 0x100) == 0) {
    rhs = &in_RDI[1].nameMap;
    LookupLocation::LookupLocation
              (local_58,(Scope *)&in_RDI[1].nameMap,*(uint32_t *)((long)&in_RDI[4].nameMap + 4));
    bitmask<slang::ast::ASTFlags>::bitmask(&local_60,None);
    lookupLocation.index = in_stack_ffffffffffffff50;
    lookupLocation.scope = (Scope *)in_stack_ffffffffffffff48;
    lookupLocation._12_4_ = in_stack_ffffffffffffff54;
    ASTContext::ASTContext
              ((ASTContext *)in_stack_ffffffffffffff38,in_RDI,lookupLocation,
               in_stack_ffffffffffffff40);
    local_68 = 0;
    local_69 = 0;
    local_88 = Scope::membersOfType<slang::ast::ClassPropertySymbol>
                         ((Scope *)in_stack_ffffffffffffff40.m_bits);
    local_78 = &local_88;
    std::ranges::
    subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_(std::ranges::subrange_kind)0>
    ::begin(local_78);
    std::ranges::
    subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_(std::ranges::subrange_kind)0>
    ::end(local_78);
    while (bVar1 = operator==<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>_>
                             ((self_type *)in_RDI,
                              (specific_symbol_iterator<slang::ast::ClassPropertySymbol> *)rhs),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_false>
      ::operator*((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_false>
                   *)0x331a0b);
      ValueSymbol::getType((ValueSymbol *)0x331a1a);
      uVar2 = Type::getBitstreamWidth((Type *)in_stack_ffffffffffffff38);
      if (uVar2 == 0) {
        local_69 = 1;
      }
      local_68 = uVar2 + local_68;
      if (0x3fffffff8 < local_68) {
        ASTContext::addDiag((ASTContext *)in_stack_ffffffffffffff40.m_bits,(DiagCode)0x180009,
                            (SourceLocation)in_RDI->firstMember);
        return;
      }
      iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_false>
      ::operator++<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>_>
                ((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_false>
                  *)in_RDI);
    }
    if ((local_69 & 1) == 0) {
      std::optional<unsigned_long>::optional<unsigned_long_&,_true>
                ((optional<unsigned_long> *)in_RDI,(unsigned_long *)rhs);
      in_RDI[4].compilation = in_stack_ffffffffffffff38;
      in_RDI[4].thisSym = (Symbol *)in_stack_ffffffffffffff40.m_bits;
    }
  }
  return;
}

Assistant:

void ClassType::computeSize() const {
    ensureElaborated();
    cachedBitstreamWidth = 0;
    if (isInterface)
        return;

    ASTContext context(*this, LookupLocation(this, uint32_t(headerIndex)));

    // Note: no worry of class cycles here because we set cachedBitstreamWidth
    // to zero up above, which will avoid re-entering this function.
    uint64_t totalWidth = 0;
    bool hasDynamic = false;
    for (auto& prop : membersOfType<ClassPropertySymbol>()) {
        uint64_t width = prop.getType().getBitstreamWidth();
        if (width == 0)
            hasDynamic = true;

        totalWidth += width;
        if (totalWidth > MaxBitWidth) {
            context.addDiag(diag::ObjectTooLarge, location);
            return;
        }
    }

    if (!hasDynamic)
        cachedBitstreamWidth = totalWidth;
}